

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

bool __thiscall
helics::FederateState::messageShouldBeDelayed(FederateState *this,ActionMessage *cmd)

{
  __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  __last;
  bool bVar1;
  size_type sVar2;
  GlobalFederateId *pGVar3;
  const_reference pvVar4;
  reference this_00;
  long in_RSI;
  long in_RDI;
  __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  *__lhs;
  __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  res;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
  *in_stack_ffffffffffffff70;
  GlobalFederateId *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  local_30;
  BaseType local_24;
  BaseType local_20;
  BaseType local_1c;
  long local_18;
  bool local_1;
  
  local_18 = in_RSI;
  sVar2 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::size
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     (in_RDI + 0x4f0));
  if (sVar2 == 0) {
    local_1 = false;
  }
  else if (sVar2 == 1) {
    pGVar3 = (GlobalFederateId *)(local_18 + 8);
    pvVar4 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::front
                       (in_stack_ffffffffffffff70);
    local_1c = pvVar4->gid;
    local_1 = GlobalFederateId::operator==(pGVar3,(GlobalFederateId)local_1c);
  }
  else if (sVar2 == 2) {
    pGVar3 = (GlobalFederateId *)(local_18 + 8);
    pvVar4 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::front
                       (in_stack_ffffffffffffff70);
    local_20 = pvVar4->gid;
    bVar1 = GlobalFederateId::operator==(pGVar3,(GlobalFederateId)local_20);
    local_1 = true;
    if (!bVar1) {
      pvVar4 = std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::
               back(in_stack_ffffffffffffff70);
      local_24 = pvVar4->gid;
      local_1 = GlobalFederateId::operator==
                          ((GlobalFederateId *)(local_18 + 8),(GlobalFederateId)local_24);
    }
  }
  else {
    __lhs = (__normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
             *)(in_RDI + 0x4f0);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::begin
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::end
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    __last._M_current._7_1_ = in_stack_ffffffffffffff97;
    __last._M_current._0_7_ = in_stack_ffffffffffffff90;
    local_30 = std::
               lower_bound<__gnu_cxx::__normal_iterator<helics::GlobalFederateId_const*,std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>>,helics::GlobalFederateId>
                         (in_stack_ffffffffffffff98,__last,in_stack_ffffffffffffff88);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::end
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    bVar1 = __gnu_cxx::
            operator==<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                      (__lhs,(__normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    local_1 = false;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
                ::operator*(&local_30);
      local_1 = GlobalFederateId::operator==(this_00,(GlobalFederateId)*(BaseType *)(local_18 + 8));
    }
  }
  return local_1;
}

Assistant:

bool FederateState::messageShouldBeDelayed(const ActionMessage& cmd) const noexcept
{
    switch (delayedFederates.size()) {
        case 0:
            return false;
        case 1:
            return (cmd.source_id == delayedFederates.front());
        case 2:
            return ((cmd.source_id == delayedFederates.front()) ||
                    (cmd.source_id == delayedFederates.back()));
        default: {
            auto res =
                std::lower_bound(delayedFederates.begin(), delayedFederates.end(), cmd.source_id);
            return ((res != delayedFederates.end()) && (*res == cmd.source_id));
        }
    }
}